

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_mtbdd.c
# Opt level: O1

void mtbdd_gc_mark_protected_WRAP(WorkerP *w,Task *__dq_head,TD_mtbdd_gc_mark_protected *t)

{
  undefined8 uVar1;
  Worker *pWVar2;
  undefined8 *puVar3;
  uint uVar4;
  long lVar5;
  long lVar6;
  Task *pTVar7;
  uint64_t *puStack_38;
  
  lVar6 = 0;
  puStack_38 = protect_iter(&mtbdd_protected,0,mtbdd_protected.refs_size);
  if (puStack_38 != (uint64_t *)0x0) {
    lVar5 = (long)__dq_head << 0x1a;
    lVar6 = 0;
    pTVar7 = __dq_head;
    do {
      puVar3 = (undefined8 *)protect_next(&mtbdd_protected,&puStack_38,mtbdd_protected.refs_size);
      if (__dq_head == w->end) {
        lace_abort_stack_overflow();
      }
      uVar1 = *puVar3;
      __dq_head->f = mtbdd_gc_mark_rec_WRAP;
      __dq_head->thief = (_Worker *)0x1;
      *(undefined8 *)__dq_head->d = uVar1;
      pWVar2 = w->_public;
      if (w->allstolen == '\0') {
        if (pWVar2->movesplit != '\0') {
          uVar4 = (uint)((int)((ulong)((long)pTVar7 - (long)w->dq) >> 6) + 2 +
                        (int)((ulong)((long)w->split - (long)w->dq) >> 6)) >> 1;
          LOCK();
          (pWVar2->ts).ts.split = uVar4;
          UNLOCK();
          w->split = w->dq + uVar4;
          pWVar2->movesplit = '\0';
        }
      }
      else {
        if (pWVar2->movesplit != '\0') {
          pWVar2->movesplit = '\0';
        }
        LOCK();
        (pWVar2->ts).v =
             (lVar5 + (long)w->dq * -0x4000000 & 0xffffffff00000000U) + 0x100000000 |
             (ulong)((long)pTVar7 - (long)w->dq) >> 6 & 0xffffffff;
        UNLOCK();
        pWVar2->allstolen = '\0';
        w->split = __dq_head + 1;
        w->allstolen = '\0';
      }
      __dq_head = __dq_head + 1;
      lVar6 = lVar6 + 1;
      lVar5 = lVar5 + 0x100000000;
      pTVar7 = pTVar7 + 1;
    } while (puStack_38 != (uint64_t *)0x0);
  }
  for (; lVar6 != 0; lVar6 = lVar6 + -1) {
    pTVar7 = __dq_head + -1;
    if ((w->_public->movesplit == '\0') && (w->split <= pTVar7)) {
      __dq_head[-1].thief = (_Worker *)0x0;
      mtbdd_gc_mark_rec_CALL(w,pTVar7,*(MDD *)__dq_head[-1].d);
    }
    else {
      mtbdd_gc_mark_rec_SYNC_SLOW(w,pTVar7);
    }
    __dq_head = pTVar7;
  }
  return;
}

Assistant:

VOID_TASK_0(mtbdd_gc_mark_protected)
{
    // iterate through refs hash table, mark all found
    size_t count=0;
    uint64_t *it = protect_iter(&mtbdd_protected, 0, mtbdd_protected.refs_size);
    while (it != NULL) {
        BDD *to_mark = (BDD*)protect_next(&mtbdd_protected, &it, mtbdd_protected.refs_size);
        SPAWN(mtbdd_gc_mark_rec, *to_mark);
        count++;
    }
    while (count--) {
        SYNC(mtbdd_gc_mark_rec);
    }
}